

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_2::ValidateAccessChain(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  short sVar2;
  ushort uVar3;
  uint32_t id;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  int32_t iVar9;
  char *pcVar10;
  long *plVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  DiagnosticStream *pDVar14;
  _func_int **pp_Var15;
  long *plVar16;
  long lVar17;
  long lVar18;
  size_t index;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  spv_result_t unaff_R13D;
  bool bVar22;
  string instr_name;
  int64_t cur_index;
  Instruction *local_298;
  long *local_288;
  long local_278;
  long lStack_270;
  undefined4 local_264;
  string local_260;
  long local_240;
  string local_238;
  long local_218;
  long local_210;
  undefined1 *local_208 [2];
  long local_1f8 [56];
  spv_result_t local_38;
  
  pcVar10 = spvOpcodeString((uint)*(ushort *)
                                   ((long)&(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,pcVar10,(allocator<char> *)&local_260);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x7c6340);
  local_288 = &local_278;
  plVar16 = plVar11 + 2;
  if ((long *)*plVar11 == plVar16) {
    local_278 = *plVar16;
    lStack_270 = plVar11[3];
  }
  else {
    local_278 = *plVar16;
    local_288 = (long *)*plVar11;
  }
  lVar17 = plVar11[1];
  *plVar11 = (long)plVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if (local_208[0] != &((DiagnosticStream *)local_208)->field_0x10) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  bVar5 = spvOpcodeGeneratesUntypedPointer
                    ((uint)*(ushort *)
                            ((long)&(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2));
  pIVar12 = ValidationState_t::FindDef
                      (_,*(uint32_t *)
                          &(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
  if (bVar5) {
    if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x1141)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288,lVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_
                (&local_260,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
      pcVar10 = " must be OpTypeUntypedPointerKHR. Found Op";
      lVar17 = 0x2a;
      goto LAB_00697dfb;
    }
LAB_00697cd9:
    index = 2;
    if (bVar5) {
      uVar8 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar13 = ValidationState_t::FindDef(_,uVar8);
      if ((((pIVar13 == (Instruction *)0x0) ||
           (iVar9 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar9 == 0)) ||
          (uVar1 = (pIVar13->inst_).opcode, uVar1 == 0x1141)) || (uVar1 == 0x20)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Base type must be a non-pointer type",0x24);
        unaff_R13D = local_38;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar22 = false;
      }
      else {
        bVar22 = true;
      }
      index = 3;
      if (!bVar22) goto LAB_00697e62;
    }
    uVar8 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,index);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    pIVar13 = ValidationState_t::FindDef(_,(pIVar13->inst_).type_id);
    if ((pIVar13 == (Instruction *)0x0) ||
       (uVar1 = (pIVar13->inst_).opcode, (uVar1 != 0x1141 || !bVar5) && uVar1 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"The Base <id> ",0xe);
      ValidationState_t::getIdName_abi_cxx11_(&local_260,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," in ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288,lVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," instruction must be a pointer.",0x1f);
      unaff_R13D = local_38;
      goto LAB_00697e3b;
    }
    puVar4 = (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[2] == puVar4[2]) {
      if (bVar5) {
        uVar8 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      }
      else {
        uVar8 = puVar4[3];
      }
      local_298 = ValidationState_t::FindDef(_,uVar8);
      sVar2 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      if ((((long)(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ -
            (long)(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                  _vptr_IntrusiveNodeBase >> 2) -
          (ulong)((sVar2 == 0x46 || sVar2 == 0x43) || (ushort)(sVar2 + 0xeeb9U) < 2)) - 4 <=
          (ulong)(_->options_->universal_limits_).max_access_chain_indexes) {
        uVar21 = (ulong)((sVar2 == 0x46 || sVar2 == 0x43) || (ushort)(sVar2 + 0xeeb9U) < 2) +
                 (ulong)bVar5 + 4;
        pp_Var15 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                   _vptr_IntrusiveNodeBase;
        bVar22 = uVar21 < (ulong)((long)(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                        next_node_ - (long)pp_Var15 >> 2);
        if (bVar22) {
          do {
            id = *(uint32_t *)((long)pp_Var15 + uVar21 * 4);
            pIVar13 = ValidationState_t::FindDef(_,id);
            pIVar13 = ValidationState_t::FindDef(_,(pIVar13->inst_).type_id);
            if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x15)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Indexes passed to ",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,(char *)local_288,lVar17);
              lVar18 = 0x19;
              pcVar10 = " must be of type integer.";
LAB_00698261:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,pcVar10,lVar18);
              unaff_R13D = local_38;
LAB_00698279:
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              cVar7 = '\0';
            }
            else {
              uVar3 = (local_298->inst_).opcode;
              uVar8 = (uint)uVar3;
              if (uVar3 < 0x1168) {
                if (0x1e < uVar8) goto LAB_006982e8;
                if ((0x31800000U >> (uVar8 & 0x1f) & 1) != 0) goto LAB_006982a7;
                if (uVar8 != 0x1e) goto LAB_006982e8;
                uVar19 = (ulong)id;
                bVar6 = ValidationState_t::EvalConstantValInt64(_,id,&local_240);
                if (!bVar6) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"The <id> passed to ",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(char *)local_288,lVar17);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," to index ",10);
                  ValidationState_t::getIdName_abi_cxx11_(&local_260,_,id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_260._M_dataplus._M_p,
                             local_260._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," into a structure must be an OpConstant.",0x28);
                  unaff_R13D = local_38;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_00698279;
                }
                puVar4 = (local_298->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar20 = (long)(local_298->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
                lVar18 = lVar20 + -2;
                local_264 = (undefined4)
                            CONCAT71((int7)(uVar19 >> 8),-1 < local_240 && local_240 < lVar18);
                if (-1 < local_240 && local_240 < lVar18) {
                  local_298 = ValidationState_t::FindDef(_,puVar4[local_240 + 2]);
                }
                else {
                  local_218 = lVar18;
                  local_210 = lVar20;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Index ",6);
                  ValidationState_t::getIdName_abi_cxx11_(&local_260,_,id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_260._M_dataplus._M_p,
                             local_260._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," is out of bounds: ",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(char *)local_288,lVar17);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," cannot find index ",0x13);
                  std::ostream::_M_insert<long>((long)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," into the structure <id> ",0x19);
                  ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_298->inst_).result_id)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,". This structure has ",0x15);
                  std::ostream::_M_insert<long>((long)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," members. Largest valid index is ",0x21);
                  std::ostream::_M_insert<long>((long)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
                  unaff_R13D = local_38;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p != &local_238.field_2) {
                    operator_delete(local_238._M_dataplus._M_p,
                                    local_238.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                }
                cVar7 = (char)local_264;
              }
              else {
                if (uVar8 == 0x14a7 || uVar3 < 0x14a7) {
                  if ((uVar8 != 0x1168) && (uVar8 != 0x13d4)) {
LAB_006982e8:
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_288,lVar17);
                    lVar18 = 0x47;
                    pcVar10 = 
                    " reached non-composite type while indexes still remain to be traversed.";
                    goto LAB_00698261;
                  }
                }
                else if ((uVar8 != 0x14ee) && (uVar8 != 0x14a8)) goto LAB_006982e8;
LAB_006982a7:
                local_298 = ValidationState_t::FindDef
                                      (_,(local_298->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[2]);
                cVar7 = '\x01';
              }
            }
            if (cVar7 == '\0') break;
            uVar21 = uVar21 + 1;
            pp_Var15 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                       _vptr_IntrusiveNodeBase;
            bVar22 = uVar21 < (ulong)((long)(inst->
                                            super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                            next_node_ - (long)pp_Var15 >> 2);
          } while (bVar22);
        }
        if (!bVar22) {
          if ((bVar5) ||
             (pIVar12 = ValidationState_t::FindDef
                                  (_,(pIVar12->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3]),
             (local_298->inst_).result_id == (pIVar12->inst_).result_id)) {
            unaff_R13D = SPV_SUCCESS;
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_288,lVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," result type (Op",0x10);
            local_260._M_dataplus._M_p = spvOpcodeString((uint)(pIVar12->inst_).opcode);
            pDVar14 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_208,(char **)&local_260);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar14,
                       ") does not match the type that results from indexing into the base <id> (Op"
                       ,0x4b);
            local_238._M_dataplus._M_p = spvOpcodeString((uint)(local_298->inst_).opcode);
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(char **)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar14,").",2);
            unaff_R13D = pDVar14->error_;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          }
        }
        goto LAB_00697e62;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The number of indexes in ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288,lVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," may not exceed ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,". Found ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      pcVar10 = " indexes.";
      lVar17 = 9;
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "The result pointer storage class and base pointer storage class in ",0x43);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288,lVar17);
      pcVar10 = " do not match.";
      lVar17 = 0xe;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar10,lVar17);
    unaff_R13D = local_38;
  }
  else {
    if ((pIVar12 != (Instruction *)0x0) && ((pIVar12->inst_).opcode == 0x20)) goto LAB_00697cd9;
    ValidationState_t::diag
              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"The Result Type of ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_288,lVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
    ValidationState_t::getIdName_abi_cxx11_
              (&local_260,_,
               *(uint32_t *)
                ((long)&(inst->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
    pcVar10 = " must be OpTypePointer. Found Op";
    lVar17 = 0x20;
LAB_00697dfb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar10,lVar17);
    local_238._M_dataplus._M_p = spvOpcodeString((uint)(pIVar12->inst_).opcode);
    pDVar14 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar14,".",1);
    unaff_R13D = pDVar14->error_;
LAB_00697e3b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_00697e62:
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  return unaff_R13D;
}

Assistant:

spv_result_t ValidateAccessChain(ValidationState_t& _,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  const bool untyped_pointer = spvOpcodeGeneratesUntypedPointer(inst->opcode());

  // The result type must be OpTypePointer for regular access chains and an
  // OpTypeUntypedPointerKHR for untyped access chains.
  auto result_type = _.FindDef(inst->type_id());
  if (untyped_pointer) {
    if (!result_type ||
        spv::Op::OpTypeUntypedPointerKHR != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id())
             << " must be OpTypeUntypedPointerKHR. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  } else {
    if (!result_type || spv::Op::OpTypePointer != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  }

  if (untyped_pointer) {
    // Base type must be a non-pointer type.
    const auto base_type = _.FindDef(inst->GetOperandAs<uint32_t>(2));
    if (!base_type || !spvOpcodeGeneratesType(base_type->opcode()) ||
        base_type->opcode() == spv::Op::OpTypePointer ||
        base_type->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Base type must be a non-pointer type";
    }
  }

  // Base must be a pointer, pointing to the base of a composite object.
  const auto base_index = untyped_pointer ? 3 : 2;
  const auto base_id = inst->GetOperandAs<uint32_t>(base_index);
  const auto base = _.FindDef(base_id);
  const auto base_type = _.FindDef(base->type_id());
  if (!base_type || !(spv::Op::OpTypePointer == base_type->opcode() ||
                      (untyped_pointer && spv::Op::OpTypeUntypedPointerKHR ==
                                              base_type->opcode()))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Base <id> " << _.getIdName(base_id) << " in " << instr_name
           << " instruction must be a pointer.";
  }

  // The result pointer storage class and base pointer storage class must match.
  // Word 2 of OpTypePointer is the Storage Class.
  auto result_type_storage_class = result_type->word(2);
  auto base_type_storage_class = base_type->word(2);
  if (result_type_storage_class != base_type_storage_class) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The result pointer storage class and base "
              "pointer storage class in "
           << instr_name << " do not match.";
  }

  // The type pointed to by OpTypePointer (word 3) must be a composite type.
  auto type_pointee = untyped_pointer
                          ? _.FindDef(inst->GetOperandAs<uint32_t>(2))
                          : _.FindDef(base_type->word(3));

  // Check Universal Limit (SPIR-V Spec. Section 2.17).
  // The number of indexes passed to OpAccessChain may not exceed 255
  // The instruction includes 4 words + N words (for N indexes)
  size_t num_indexes = inst->words().size() - 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    // In pointer access chains, the element operand is required, but not
    // counted as an index.
    --num_indexes;
  }
  const size_t num_indexes_limit =
      _.options()->universal_limits_.max_access_chain_indexes;
  if (num_indexes > num_indexes_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The number of indexes in " << instr_name << " may not exceed "
           << num_indexes_limit << ". Found " << num_indexes << " indexes.";
  }
  // Indexes walk the type hierarchy to the desired depth, potentially down to
  // scalar granularity. The first index in Indexes will select the top-level
  // member/element/component/element of the base composite. All composite
  // constituents use zero-based numbering, as described by their OpType...
  // instruction. The second index will apply similarly to that result, and so
  // on. Once any non-composite type is reached, there must be no remaining
  // (unused) indexes.
  auto starting_index = untyped_pointer ? 5 : 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    ++starting_index;
  }
  for (size_t i = starting_index; i < inst->words().size(); ++i) {
    const uint32_t cur_word = inst->words()[i];
    // Earlier ID checks ensure that cur_word definition exists.
    auto cur_word_instr = _.FindDef(cur_word);
    // The index must be a scalar integer type (See OpAccessChain in the Spec.)
    auto index_type = _.FindDef(cur_word_instr->type_id());
    if (!index_type || spv::Op::OpTypeInt != index_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Indexes passed to " << instr_name
             << " must be of type integer.";
    }
    switch (type_pointee->opcode()) {
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeVectorNV:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeNodePayloadArrayAMDX: {
        // In OpTypeMatrix, OpTypeVector, spv::Op::OpTypeCooperativeMatrixNV,
        // OpTypeCooperativeVectorNV, OpTypeArray, and OpTypeRuntimeArray, word
        // 2 is the Element Type.
        type_pointee = _.FindDef(type_pointee->word(2));
        break;
      }
      case spv::Op::OpTypeStruct: {
        // In case of structures, there is an additional constraint on the
        // index: the index must be an OpConstant.
        int64_t cur_index;
        if (!_.EvalConstantValInt64(cur_word, &cur_index)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "The <id> passed to " << instr_name << " to index "
                 << _.getIdName(cur_word)
                 << " into a "
                    "structure must be an OpConstant.";
        }

        // The index points to the struct member we want, therefore, the index
        // should be less than the number of struct members.
        const int64_t num_struct_members =
            static_cast<int64_t>(type_pointee->words().size() - 2);
        if (cur_index >= num_struct_members || cur_index < 0) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Index " << _.getIdName(cur_word)
                 << " is out of bounds: " << instr_name << " cannot find index "
                 << cur_index << " into the structure <id> "
                 << _.getIdName(type_pointee->id()) << ". This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        // Struct members IDs start at word 2 of OpTypeStruct.
        const size_t word_index = static_cast<size_t>(cur_index) + 2;
        auto structMemberId = type_pointee->word(word_index);
        type_pointee = _.FindDef(structMemberId);
        break;
      }
      default: {
        // Give an error. reached non-composite type while indexes still remain.
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << instr_name
               << " reached non-composite type while indexes "
                  "still remain to be traversed.";
      }
    }
  }

  if (!untyped_pointer) {
    // Result type is a pointer. Find out what it's pointing to.
    // This will be used to make sure the indexing results in the same type.
    // OpTypePointer word 3 is the type being pointed to.
    const auto result_type_pointee = _.FindDef(result_type->word(3));
    // At this point, we have fully walked down from the base using the indeces.
    // The type being pointed to should be the same as the result type.
    if (type_pointee->id() != result_type_pointee->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << instr_name << " result type (Op"
             << spvOpcodeString(
                    static_cast<spv::Op>(result_type_pointee->opcode()))
             << ") does not match the type that results from indexing into the "
                "base "
                "<id> (Op"
             << spvOpcodeString(static_cast<spv::Op>(type_pointee->opcode()))
             << ").";
    }
  }

  return SPV_SUCCESS;
}